

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * Path::relpath(string *__return_storage_ptr__,string *base,string *path)

{
  string local_38;
  
  basedir(&local_38,base);
  join(__return_storage_ptr__,&local_38,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string relpath(const string &base, const string &path)
{
	return Path::join(basedir(base), path);
}